

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetSourceFilePropertyCommand::Clone(cmGetSourceFilePropertyCommand *this)

{
  cmCommand *this_00;
  cmGetSourceFilePropertyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmGetSourceFilePropertyCommand((cmGetSourceFilePropertyCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmGetSourceFilePropertyCommand; }